

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Request * __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::request
          (Request *__return_storage_ptr__,NetworkAddressHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> expectedBodySize)

{
  uint *puVar1;
  Promise<kj::HttpClient::Response> *params;
  AsyncOutputStream *pAVar2;
  PromiseNode *pPVar3;
  PromiseArena *pPVar4;
  Maybe<unsigned_long> expectedBodySize_00;
  Request *this_00;
  undefined8 *puVar5;
  void *pvVar6;
  Refcounted *refcounted_1;
  SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5977:9)>
  *location;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_stack_ffffffffffffff70;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_80;
  void *continuationTracePtr;
  RefcountedClient *local_70;
  Request *local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  char local_48 [8];
  Disposer *local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  local_68 = __return_storage_ptr__;
  getClient((NetworkAddressHttpClient *)&refcounted);
  this_00 = local_68;
  local_48[0] = *(char *)expectedBodySize.ptr._0_8_;
  if (local_48[0] == '\x01') {
    local_40 = *(Disposer **)(expectedBodySize.ptr._0_8_ + 8);
  }
  expectedBodySize_00.ptr.field_1.value = in_stack_ffffffffffffff70.value;
  expectedBodySize_00.ptr._0_8_ = local_48;
  HttpClientImpl::request
            (local_68,((refcounted.ptr)->client).ptr,method,url,headers,expectedBodySize_00);
  puVar1 = &((refcounted.ptr)->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  continuationTracePtr = refcounted.ptr;
  local_70 = refcounted.ptr;
  pAVar2 = (this_00->body).ptr;
  puVar5 = (undefined8 *)operator_new(0x28);
  puVar5[1] = refcounted.ptr;
  local_70 = (RefcountedClient *)0x0;
  puVar5[2] = refcounted.ptr;
  puVar5[3] = (this_00->body).disposer;
  puVar5[4] = pAVar2;
  (this_00->body).ptr = (AsyncOutputStream *)0x0;
  *puVar5 = &PTR_disposeImpl_005926e8;
  Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
            (&this_00->body,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)&stack0xffffffffffffff70);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&stack0xffffffffffffff70);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)&continuationTracePtr);
  params = &this_00->response;
  refcounted.ptr = (RefcountedClient *)0x0;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5977:9)>
       ::anon_class_16_1_81fbabb9_for_func::operator();
  pPVar3 = (this_00->response).super_PromiseBase.node.ptr;
  pPVar4 = (pPVar3->super_PromiseArenaMember).arena;
  if (pPVar4 == (PromiseArena *)0x0 || (ulong)((long)pPVar3 - (long)pPVar4) < 0x30) {
    pvVar6 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5977:9)>
                *)((long)pvVar6 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::HttpClient::Response,kj::(anonymous_namespace)::NetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::HttpClient::Response&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::HttpClient::Response&&)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,
               (anon_class_16_1_81fbabb9_for_func *)&stack0xffffffffffffff70,&continuationTracePtr);
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    (pPVar3->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location = (SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5977:9)>
                *)(pPVar3 + -3);
    ctor<kj::_::SimpleTransformPromiseNode<kj::HttpClient::Response,kj::(anonymous_namespace)::NetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::HttpClient::Response&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::HttpClient::Response&&)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,
               (anon_class_16_1_81fbabb9_for_func *)&stack0xffffffffffffff70,&continuationTracePtr);
    pPVar3[-3].super_PromiseArenaMember.arena = pPVar4;
  }
  local_60.ptr = (PromiseNode *)0x0;
  local_38.ptr = (PromiseNode *)0x0;
  local_80.ptr = (PromiseNode *)location;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,&local_80);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_80);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)&stack0xffffffffffffff70);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            (&refcounted);
  return this_00;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    auto refcounted = getClient();
    auto result = refcounted->client->request(method, url, headers, expectedBodySize);
    result.body = result.body.attach(kj::addRef(*refcounted));
    result.response = result.response.then(
        [refcounted=kj::mv(refcounted)](Response&& response) mutable {
      response.body = response.body.attach(kj::mv(refcounted));
      return kj::mv(response);
    });
    return result;
  }